

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

float __thiscall LumaQuantizer::transformPQ(LumaQuantizer *this,float val,bool encode)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float Vp;
  float Lp;
  float c3;
  float c2;
  float c1;
  float n;
  float m;
  float L;
  bool encode_local;
  LumaQuantizer *pLStack_18;
  float val_local;
  LumaQuantizer *this_local;
  
  n = this->m_Lmax;
  c1 = 78.8438;
  c2 = 0.1593;
  c3 = 0.8359;
  Lp = 18.8516;
  Vp = 18.6875;
  m._3_1_ = encode;
  L = val;
  pLStack_18 = this;
  if (encode) {
    dVar3 = std::pow((double)(ulong)(uint)(val / n),5.15058112726231e-315);
    local_3c = SUB84(dVar3,0);
    dVar3 = std::pow((double)(ulong)(uint)((local_3c * 18.8516 + 0.8359) /
                                          (local_3c * 18.6875 + 1.0)),5.52182820466472e-315);
    this_local._4_4_ = SUB84(dVar3,0);
  }
  else {
    dVar3 = std::pow((double)(ulong)(uint)val,4.99926720412382e-315);
    fVar1 = n;
    local_40 = SUB84(dVar3,0);
    local_44 = 0.0;
    local_48 = local_40 - 0.8359;
    pfVar2 = std::max<float>(&local_44,&local_48);
    dVar3 = std::pow((double)(ulong)(uint)(*pfVar2 / (local_40 * -18.6875 + 18.8516)),
                     5.37003221179426e-315);
    this_local._4_4_ = fVar1 * SUB84(dVar3,0);
  }
  return this_local._4_4_;
}

Assistant:

float LumaQuantizer::transformPQ(float val, bool encode)
{
    const float L = m_Lmax,
	      		m = 78.8438, n = 0.1593,
	      		c1 = 0.8359, c2 = 18.8516, c3 = 18.6875;
    	
	if (encode)
	{
	    float Lp = pow(val/L, n);
        return pow((c1 + c2*Lp) / (1 + c3*Lp), m);
	}
	else
	{
	    float Vp = pow(val, 1.0f/m);
        return L * pow( std::max(0.0f, (Vp-c1)) / (c2-c3*Vp), 1.0f/n);
    }
}